

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O1

void __thiscall helics::LogManager::logFlush(LogManager *this)

{
  logger *plVar1;
  
  plVar1 = (this->consoleLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (plVar1 != (logger *)0x0) {
    spdlog::logger::flush(plVar1);
  }
  plVar1 = (this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (plVar1 != (logger *)0x0) {
    spdlog::logger::flush(plVar1);
    return;
  }
  return;
}

Assistant:

void LogManager::logFlush()
{
    if (consoleLogger) {
        consoleLogger->flush();
    }
    if (fileLogger) {
        fileLogger->flush();
    }
}